

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create_integration_rule.unit.cpp
# Opt level: O2

void __thiscall
TestCreateIntegrationRule_TestCreateIntegrationRule_Rectangular_Test::
TestCreateIntegrationRule_TestCreateIntegrationRule_Rectangular_Test
          (TestCreateIntegrationRule_TestCreateIntegrationRule_Rectangular_Test *this)

{
  TestCreateIntegrationRule::TestCreateIntegrationRule(&this->super_TestCreateIntegrationRule);
  (this->super_TestCreateIntegrationRule).super_Test._vptr_Test = (_func_int **)&PTR__Test_001781c0;
  return;
}

Assistant:

TEST_F(TestCreateIntegrationRule, TestCreateIntegrationRule_Rectangular) {
	SCOPED_TRACE("Begin Test: Create Rectangular Integration Rule.");

	std::string line = "Rectangular";
	Integration_Rule rule = create_integration_rule(line);

	EXPECT_EQ(rule.type, Integration_Rule_Type::RECTANGULAR);

	line = "Rectangular (Normalized, k=1.0)";
	rule = create_integration_rule(line);

	EXPECT_EQ(rule.type, Integration_Rule_Type::RECTANGULAR);
	EXPECT_EQ(rule.k, 1.0);
}